

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewSequentialFile
          (InMemoryEnv *this,string *fname,SequentialFile **result)

{
  bool bVar1;
  SequentialFileImpl *this_00;
  mapped_type *ppFVar2;
  Mutex *in_RCX;
  Slice local_60;
  Slice local_50;
  _Self local_40;
  _Self local_38;
  MutexLock local_30;
  MutexLock lock;
  SequentialFile **result_local;
  string *fname_local;
  InMemoryEnv *this_local;
  
  lock.mu_ = in_RCX;
  MutexLock::MutexLock(&local_30,(Mutex *)&fname->field_2);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
               *)((long)&fname[1].field_2 + 8),(key_type *)result);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
              *)((long)&fname[1].field_2 + 8));
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    ((lock.mu_)->mu_).super___mutex_base._M_mutex.__align = 0;
    Slice::Slice(&local_50,(string *)result);
    Slice::Slice(&local_60,"File not found");
    Status::IOError((Status *)this,&local_50,&local_60);
  }
  else {
    this_00 = (SequentialFileImpl *)operator_new(0x18);
    ppFVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                            *)((long)&fname[1].field_2 + 8),(key_type *)result);
    SequentialFileImpl::SequentialFileImpl(this_00,*ppFVar2);
    *(SequentialFileImpl **)&((lock.mu_)->mu_).super___mutex_base._M_mutex = this_00;
    Status::OK();
  }
  MutexLock::~MutexLock(&local_30);
  return (Status)(char *)this;
}

Assistant:

Status NewSequentialFile(const std::string& fname,
                           SequentialFile** result) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      *result = nullptr;
      return Status::IOError(fname, "File not found");
    }

    *result = new SequentialFileImpl(file_map_[fname]);
    return Status::OK();
  }